

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O0

void do_snare(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *in_RDI;
  AFFECT_DATA snaretimer;
  ROOM_AFFECT_DATA af;
  CHAR_DATA *in_stack_ffffffffffffff38;
  CHAR_DATA *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined2 in_stack_ffffffffffffff50;
  undefined2 in_stack_ffffffffffffff52;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff54;
  short sVar4;
  undefined2 in_stack_ffffffffffffff56;
  short sVar5;
  
  iVar2 = get_skill((CHAR_DATA *)snaretimer.tick_fun,snaretimer._60_4_);
  if (iVar2 < 5) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff56,
                                  CONCAT24(in_stack_ffffffffffffff54,
                                           CONCAT22(in_stack_ffffffffffffff52,
                                                    in_stack_ffffffffffffff50))),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else {
    bVar1 = is_affected(in_RDI,(int)gsn_snaretimer);
    if (bVar1) {
      send_to_char((char *)CONCAT26(in_stack_ffffffffffffff56,
                                    CONCAT24(in_stack_ffffffffffffff54,
                                             CONCAT22(in_stack_ffffffffffffff52,
                                                      in_stack_ffffffffffffff50))),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    else {
      bVar1 = is_affected_room(in_RDI->in_room,(int)gsn_snare);
      if (bVar1) {
        send_to_char((char *)CONCAT26(in_stack_ffffffffffffff56,
                                      CONCAT24(in_stack_ffffffffffffff54,
                                               CONCAT22(in_stack_ffffffffffffff52,
                                                        in_stack_ffffffffffffff50))),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
      else if ((((((in_RDI->in_room->sector_type == 3) || (in_RDI->in_room->sector_type == 5)) ||
                 (in_RDI->in_room->sector_type == 10)) ||
                ((in_RDI->in_room->sector_type == 2 || (in_RDI->in_room->sector_type == 4)))) ||
               (bVar1 = is_immortal(in_stack_ffffffffffffff38), bVar1)) &&
              ((in_RDI->in_room->vnum != 0x1644 && (in_RDI->in_room->cabal == 0)))) {
        init_affect_room((ROOM_AFFECT_DATA *)0x661b92);
        new_affect_to_room((ROOM_INDEX_DATA *)
                           CONCAT26(in_stack_ffffffffffffff56,
                                    CONCAT24(in_stack_ffffffffffffff54,
                                             CONCAT22(in_stack_ffffffffffffff52,
                                                      in_stack_ffffffffffffff50))),
                           (ROOM_AFFECT_DATA *)
                           CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        init_affect((AFFECT_DATA *)0x661c2b);
        uVar3 = 0;
        sVar5 = in_RDI->level;
        sVar4 = gsn_snaretimer;
        affect_to_char(in_stack_ffffffffffffff40,(AFFECT_DATA *)in_stack_ffffffffffffff38);
        send_to_char((char *)CONCAT26(sVar5,CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff50)
                                                    )),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        act((char *)CONCAT26(sVar5,CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff50))),
            (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
            in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0);
        WAIT_STATE((CHAR_DATA *)
                   CONCAT26(sVar5,CONCAT24(sVar4,CONCAT22(uVar3,in_stack_ffffffffffffff50))),
                   in_stack_ffffffffffffff4c);
      }
      else {
        send_to_char((char *)CONCAT26(in_stack_ffffffffffffff56,
                                      CONCAT24(in_stack_ffffffffffffff54,
                                               CONCAT22(in_stack_ffffffffffffff52,
                                                        in_stack_ffffffffffffff50))),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      }
    }
  }
  return;
}

Assistant:

void do_snare(CHAR_DATA *ch, char *argument)
{
	ROOM_AFFECT_DATA af;
	AFFECT_DATA snaretimer;

	if (get_skill(ch, gsn_snare) < 5)
	{
		send_to_char("You lay some sticks down in a threatening snare to anyone under an inch tall.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_snaretimer))
	{
		send_to_char("You do not feel ready to lay a new snare yet.\n\r", ch);
		return;
	}

	if (is_affected_room(ch->in_room, gsn_snare))
	{
		send_to_char("There is already a snare here.\n\r", ch);
		return;
	}

	if ((ch->in_room->sector_type != SECT_FOREST
			&& ch->in_room->sector_type != SECT_MOUNTAIN
			&& ch->in_room->sector_type != SECT_DESERT
			&& ch->in_room->sector_type != SECT_FIELD
			&& ch->in_room->sector_type != SECT_HILLS
			&& !is_immortal(ch))
		|| (ch->in_room->vnum == 5700 || ch->in_room->cabal))
	{
		send_to_char("You cannot create a snare in this environment.\n\r", ch);
		return;
	}

	init_affect_room(&af);
	af.where = TO_ROOM_AFFECTS;
	af.aftype = AFT_SKILL;
	af.type = gsn_snare;
	af.level = ch->level;
	af.duration = 24;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.owner = ch;
	af.end_fun = nullptr;
	af.tick_fun = nullptr;
	new_affect_to_room(ch->in_room, &af);

	init_affect(&snaretimer);
	snaretimer.where = TO_AFFECTS;
	snaretimer.type = gsn_snaretimer;
	snaretimer.level = ch->level;
	snaretimer.duration = 24;
	snaretimer.location = APPLY_NONE;
	snaretimer.modifier = 0;
	snaretimer.aftype = AFT_INVIS;
	affect_to_char(ch, &snaretimer);

	send_to_char("You lay down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch);
	act("$n lays down vines and plants in a cunningly concealed snare to trap the unwary.\n\r", ch, 0, 0, TO_ROOM);

	WAIT_STATE(ch, PULSE_VIOLENCE * 4);
}